

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  uint8_t type1;
  uint8_t type2;
  ushort key;
  uint uVar1;
  bitset_container_t *c1;
  bitset_container_t *bitset;
  roaring_bitmap_t *ra;
  uint uVar2;
  roaring_bitmap_t *prVar3;
  roaring_pq_t *pq;
  roaring_pq_element_t *prVar4;
  size_t sVar5;
  roaring_array_t *prVar6;
  ushort *puVar7;
  uint end_index;
  uint64_t uVar8;
  uint32_t i;
  roaring_array_t *prVar9;
  uint uVar10;
  uint16_t key_00;
  ulong uVar11;
  roaring_bitmap_t **pprVar12;
  bool bVar13;
  uint local_b0;
  bitset_container_t *local_a8;
  roaring_pq_element_t newelement;
  roaring_pq_element_t X;
  roaring_pq_element_t x2;
  
  if (number == 1) {
    prVar3 = roaring_bitmap_copy(*x);
    return prVar3;
  }
  if (number == 0) {
    prVar3 = roaring_bitmap_create();
    return prVar3;
  }
  pq = (roaring_pq_t *)malloc(0x10);
  uVar8 = (uint64_t)number;
  prVar4 = (roaring_pq_element_t *)malloc(uVar8 * 0x18);
  pq->elements = prVar4;
  pq->size = uVar8;
  pprVar12 = &prVar4->bitmap;
  for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    prVar6 = &x[uVar11]->high_low_container;
    *pprVar12 = (roaring_bitmap_t *)prVar6;
    *(_Bool *)(pprVar12 + -1) = false;
    sVar5 = ra_portable_size_in_bytes(prVar6);
    ((roaring_pq_element_t *)(pprVar12 + -2))->size = sVar5;
    pprVar12 = pprVar12 + 3;
  }
  for (i = number >> 1; -1 < (int)i; i = i - 1) {
    percolate_down(pq,i);
  }
LAB_001162d9:
  prVar4 = &x2;
  if (uVar8 < 2) {
    pq_poll(&X,pq);
    roaring_bitmap_repair_after_lazy(X.bitmap);
    free(pq->elements);
    free(pq);
    return X.bitmap;
  }
  pq_poll(&X,pq);
  pq_poll(prVar4,pq);
  ra = x2.bitmap;
  prVar3 = X.bitmap;
  if (X.is_temporary == true) {
    if (x2.is_temporary == false) {
      roaring_bitmap_lazy_or_inplace(X.bitmap,x2.bitmap,false);
      X.size = ra_portable_size_in_bytes(&prVar3->high_low_container);
      prVar4 = &X;
      goto LAB_0011660b;
    }
    newelement.size = newelement.size & 0xffffffffffffff00;
    uVar1 = ((X.bitmap)->high_low_container).size;
    if (uVar1 == 0) {
      roaring_bitmap_free(X.bitmap);
      prVar6 = &ra->high_low_container;
    }
    else {
      end_index = ((x2.bitmap)->high_low_container).size;
      if (end_index != 0) {
        uVar10 = end_index;
        if ((int)uVar1 < (int)end_index) {
          uVar10 = uVar1;
        }
        prVar6 = &roaring_bitmap_create_with_capacity(uVar10)->high_low_container;
        puVar7 = (prVar3->high_low_container).keys;
        key_00 = *(ra->high_low_container).keys;
        uVar11 = 0;
        local_b0 = 0;
LAB_00116377:
        do {
          key = *puVar7;
          while( true ) {
            uVar10 = (uint)uVar11;
            prVar9 = &ra->high_low_container;
            if (key == key_00) break;
            if (key < key_00) {
              ra_append(prVar6,key,(prVar3->high_low_container).containers[local_b0 & 0xffff],
                        (prVar3->high_low_container).typecodes[local_b0 & 0xffff]);
              local_b0 = local_b0 + 1;
              if (local_b0 == uVar1) goto LAB_00116665;
              puVar7 = (ushort *)
                       ((ulong)((local_b0 & 0xffff) * 2) + (long)(prVar3->high_low_container).keys);
              goto LAB_00116377;
            }
            ra_append(prVar6,key_00,(ra->high_low_container).containers[uVar11 & 0xffff],
                      (ra->high_low_container).typecodes[uVar11 & 0xffff]);
            uVar2 = end_index;
            if (end_index - 1 == uVar10) goto LAB_0011663c;
            uVar11 = (ulong)(uVar10 + 1);
            key_00 = (ra->high_low_container).keys[uVar11 & 0xffff];
          }
          ra_unshare_container_at_index(&prVar3->high_low_container,(ushort)local_b0);
          type1 = (prVar3->high_low_container).typecodes[(ushort)local_b0];
          if (type1 == '\x04') {
            __assert_fail("type1 != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x4a24,
                          "roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *, roaring_bitmap_t *)"
                         );
          }
          c1 = (bitset_container_t *)(prVar3->high_low_container).containers[(ushort)local_b0];
          ra_unshare_container_at_index(&ra->high_low_container,(uint16_t)uVar11);
          type2 = (ra->high_low_container).typecodes[uVar11 & 0xffff];
          if (type2 == '\x04') {
            __assert_fail("type2 != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x4a29,
                          "roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *, roaring_bitmap_t *)"
                         );
          }
          bitset = (bitset_container_t *)(ra->high_low_container).containers[uVar11 & 0xffff];
          if ((type1 == '\x01') || (type2 != '\x01')) {
            local_a8 = (bitset_container_t *)
                       container_lazy_ior(c1,type1,bitset,type2,(uint8_t *)&newelement);
            container_free(bitset,type2);
            if (local_a8 != c1) {
              container_free(c1,type1);
            }
          }
          else {
            local_a8 = (bitset_container_t *)
                       container_lazy_ior(bitset,'\x01',c1,type1,(uint8_t *)&newelement);
            container_free(c1,type1);
            if (local_a8 != bitset) {
              bitset_container_free(bitset);
            }
          }
          ra_append(prVar6,key,local_a8,(uint8_t)newelement.size);
          local_b0 = local_b0 + 1;
          if ((local_b0 == uVar1) || (end_index - 1 == uVar10)) goto LAB_001166ca;
          uVar11 = (ulong)(uVar10 + 1);
          puVar7 = (ushort *)
                   ((ulong)((local_b0 & 0xffff) * 2) + (long)(prVar3->high_low_container).keys);
          key_00 = (ra->high_low_container).keys[uVar10 + 1 & 0xffff];
        } while( true );
      }
      roaring_bitmap_free(x2.bitmap);
      prVar6 = &prVar3->high_low_container;
    }
    goto LAB_0011668f;
  }
  if (x2.is_temporary == false) {
    prVar6 = &roaring_bitmap_lazy_or(X.bitmap,x2.bitmap,false)->high_low_container;
    newelement.size = ra_portable_size_in_bytes(prVar6);
    newelement.is_temporary = true;
    prVar4 = &newelement;
    newelement.bitmap = (roaring_bitmap_t *)prVar6;
  }
  else {
    roaring_bitmap_lazy_or_inplace(x2.bitmap,X.bitmap,false);
    x2.size = ra_portable_size_in_bytes(&ra->high_low_container);
  }
LAB_0011660b:
  pq_add(pq,prVar4);
  goto LAB_001166c1;
LAB_001166ca:
  uVar2 = uVar10 + 1;
LAB_0011663c:
  uVar10 = uVar2;
  if ((local_b0 == uVar1) ||
     (bVar13 = uVar10 == end_index, prVar9 = &prVar3->high_low_container, uVar10 = local_b0,
     end_index = uVar1, bVar13)) {
LAB_00116665:
    ra_append_move_range(prVar6,prVar9,uVar10,end_index);
  }
  ra_clear_without_containers(&prVar3->high_low_container);
  ra_clear_without_containers(&ra->high_low_container);
  free(prVar3);
  free(ra);
LAB_0011668f:
  newelement.size = ra_portable_size_in_bytes(prVar6);
  newelement.is_temporary =
       &ra->high_low_container != prVar6 || &prVar3->high_low_container != prVar6;
  newelement.bitmap = (roaring_bitmap_t *)prVar6;
  pq_add(pq,&newelement);
LAB_001166c1:
  uVar8 = pq->size;
  goto LAB_001162d9;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}